

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

void __thiscall ExceptionFreeserf::~ExceptionFreeserf(ExceptionFreeserf *this)

{
  ~ExceptionFreeserf(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

ExceptionFreeserf::~ExceptionFreeserf() {
}